

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lines.hpp
# Opt level: O1

void __thiscall
just::lines::
iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
::iterator(iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
           *this,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 begin_,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          end_)

{
  (this->_at)._M_current = begin_._M_current;
  (this->_end)._M_current = end_._M_current;
  this->_at_end = false;
  (this->_current)._M_dataplus._M_p = (pointer)&(this->_current).field_2;
  (this->_current)._M_string_length = 0;
  (this->_current).field_2._M_local_buf[0] = '\0';
  this->_last_char = '\0';
  if ((begin_._M_current != end_._M_current) && (*begin_._M_current != '\n')) {
    operator++(this);
  }
  return;
}

Assistant:

iterator(InputIt begin_, InputIt end_) :
        _at(begin_),
        _end(end_),
        _at_end(false),
        _current(),
        _last_char(0)
      {
        if (_at != _end)
        {
          if (*_at != '\n')
          {
            ++(*this);
          }
          else if (KeepNewlines)
          {
            _current = "\n";
          }
        }
      }